

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

_Bool queue_dequeue(queue_t *queue,qdata_t *data)

{
  qnode_t *node_00;
  qnode_t *node;
  _Bool status;
  qdata_t *data_local;
  queue_t *queue_local;
  
  node._7_1_ = false;
  if (((queue != (queue_t *)0x0) && (queue->len != 0)) && (data != (qdata_t *)0x0)) {
    node_00 = queue->head;
    *data = node_00->data;
    if (queue->len == 1) {
      queue->head = (qnode_t *)0x0;
      queue->tail = (qnode_t *)0x0;
    }
    else {
      queue->head = queue->head->next;
    }
    qnode_destroy(node_00);
    queue->len = queue->len - 1;
    node._7_1_ = true;
  }
  return node._7_1_;
}

Assistant:

bool queue_dequeue(queue_t *queue, qdata_t *data)
{
    bool status = false;
    qnode_t *node = NULL;

    if (queue == NULL || queue->len == 0 || data == NULL) {
        goto EXIT;
    }

    node = queue->head;
    *data = node->data;

    if (queue->len == 1) {
        queue->head = NULL;
        queue->tail = NULL;
    } else {
        queue->head = queue->head->next;
    }

    qnode_destroy(node);
    --queue->len;
    status = true;

EXIT:
    return status;
}